

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_1f3d449::EvaluateSplitConfigGenex
          (string *__return_storage_ptr__,anon_unknown_dwarf_1f3d449 *this,string_view input,
          cmGeneratorExpression *ge,cmLocalGenerator *lg,bool useOutputConfig,string *outputConfig,
          string *commandConfig,cmGeneratorTarget *target,
          set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
          *utils)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  anon_unknown_dwarf_1f3d449 *paVar4;
  string *psVar5;
  _Rb_tree_node_base *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  long lVar9;
  _Rb_tree_header *p_Var10;
  char *pcVar11;
  bool bVar12;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  undefined7 in_stack_00000009;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  uint local_ec;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  undefined1 local_d8 [16];
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  char *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_80;
  byte local_70;
  long *local_68 [2];
  long local_58 [2];
  cmLocalGenerator *local_48;
  string *local_40;
  anon_unknown_dwarf_1f3d449 *local_38;
  
  local_40 = (string *)input._M_str;
  local_e8._M_str = (char *)input._M_len;
  local_ec = (uint)lg;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&local_c8.Value.first + 0x10);
  local_e8._M_len = (size_t)this;
  local_d8._8_8_ = __return_storage_ptr__;
  local_48 = (cmLocalGenerator *)ge;
  do {
    if ((anon_unknown_dwarf_1f3d449 *)local_e8._M_len == (anon_unknown_dwarf_1f3d449 *)0x0) {
      return (string *)local_d8._8_8_;
    }
    paVar4 = (anon_unknown_dwarf_1f3d449 *)
             std::basic_string_view<char,_std::char_traits<char>_>::find(&local_e8,"$<",0,2);
    std::__cxx11::string::append((char *)local_d8._8_8_,(ulong)local_e8._M_str);
    if (paVar4 != (anon_unknown_dwarf_1f3d449 *)0xffffffffffffffff) {
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_len + -(long)paVar4);
      if (local_e8._M_len < paVar4) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   paVar4);
      }
      local_e8._M_str = local_e8._M_str + (long)paVar4;
      local_e8._M_len = (size_t)p_Var7;
      local_38 = paVar4;
      if (p_Var7 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
        bVar12 = false;
      }
      else {
        lVar9 = 1;
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
        do {
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._M_len - (long)p_Var7);
          pcVar11 = local_e8._M_str + (long)p_Var7;
          __str._M_str = "$<";
          __str._M_len = 2;
          local_c8.Value.first._M_dataplus._M_p = (pointer)p_Var8;
          local_c8.Value.first._M_string_length = (size_type)pcVar11;
          iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)(local_d8 + 0x10),0
                             ,2,__str);
          if (iVar3 == 0) {
            lVar9 = lVar9 + 1;
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var7->_vptr__Sp_counted_base + 1);
LAB_004edd17:
            bVar12 = false;
          }
          else {
            __str_00._M_str = ">";
            __str_00._M_len = 1;
            local_c8.Value.first._M_dataplus._M_p = (pointer)p_Var8;
            local_c8.Value.first._M_string_length = (size_type)pcVar11;
            iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)(local_d8 + 0x10)
                               ,0,1,__str_00);
            if ((iVar3 != 0) || (lVar9 = lVar9 + -1, lVar9 != 0)) goto LAB_004edd17;
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var7->_vptr__Sp_counted_base + 1);
            bVar12 = true;
            lVar9 = 0;
          }
        } while ((!bVar12) &&
                (p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var7->_vptr__Sp_counted_base + 1), p_Var7 < local_e8._M_len));
        bVar12 = lVar9 == 0;
      }
      pcVar11 = local_e8._M_str;
      paVar4 = (anon_unknown_dwarf_1f3d449 *)(local_e8._M_len - (long)p_Var7);
      if (local_e8._M_len < p_Var7) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   p_Var7);
      }
      local_e8._M_str = local_e8._M_str + (long)&p_Var7->_vptr__Sp_counted_base;
      psVar5 = outputConfig;
      if ((local_ec & 1) != 0) {
        psVar5 = (string *)CONCAT71(in_stack_00000009,useOutputConfig);
      }
      local_e8._M_len = (size_t)paVar4;
      if (bVar12) {
        if ((anonymous_namespace)::
            EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
            ::COMMAND_CONFIG == '\0') {
          _GLOBAL__N_1::EvaluateSplitConfigGenex();
        }
        if ((anonymous_namespace)::
            EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
            ::OUTPUT_CONFIG == '\0') {
          _GLOBAL__N_1::EvaluateSplitConfigGenex();
        }
        local_c8.Value.first._M_string_length = (size_type)pcVar11;
        __str_01._M_str = EvaluateSplitConfigGenex::COMMAND_CONFIG._M_str;
        __str_01._M_len = EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len;
        local_c8.Value.first._M_dataplus._M_p = (pointer)p_Var7;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)(local_d8 + 0x10),0,
                           EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len,__str_01);
        if (iVar3 == 0) {
          pcVar11 = pcVar11 + EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len;
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&p_Var7->_vptr__Sp_counted_base +
                   ~EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len);
          local_ec = 0;
          psVar5 = outputConfig;
        }
        else {
          local_c8.Value.first._M_string_length = (size_type)pcVar11;
          __str_02._M_str = EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_str;
          __str_02._M_len = EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len;
          local_c8.Value.first._M_dataplus._M_p = (pointer)p_Var7;
          iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)(local_d8 + 0x10),0
                             ,EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len,__str_02);
          if (iVar3 == 0) {
            pcVar11 = pcVar11 + EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len;
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var7->_vptr__Sp_counted_base +
                     ~EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len);
            local_ec = 1;
            psVar5 = (string *)CONCAT71(in_stack_00000009,useOutputConfig);
          }
        }
      }
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,pcVar11,pcVar11 + (long)&p_Var7->_vptr__Sp_counted_base);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_d8,local_40);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      local_c8.Value.first._M_string_length = 0;
      local_c8.Value.first.field_2._M_allocated_capacity =
           local_c8.Value.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_c8.Value.first._M_dataplus._M_p = (pointer)p_Var2;
      psVar5 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_d8._0_8_,local_48,psVar5,
                          (cmGeneratorTarget *)commandConfig,(cmGeneratorExpressionDAGChecker *)0x0,
                          (cmGeneratorTarget *)0x0,(string *)(local_d8 + 0x10));
      std::__cxx11::string::_M_append((char *)local_d8._8_8_,(ulong)(psVar5->_M_dataplus)._M_p);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.Value.first._M_dataplus._M_p !=
          p_Var2) {
        operator_delete(local_c8.Value.first._M_dataplus._M_p,
                        local_c8.Value.first.field_2._M_allocated_capacity + 1);
      }
      if (target != (cmGeneratorTarget *)0x0) {
        p_Var6 = (((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                    *)(local_d8._0_8_ + 0x50))->_M_t)._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
        p_Var10 = &(((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                      *)(local_d8._0_8_ + 0x50))->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var6 != p_Var10) {
          bVar12 = (bool)(~(byte)local_ec & 1);
          do {
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)(p_Var6 + 1));
            pcVar1 = (psVar5->_M_dataplus)._M_p;
            local_90 = &local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar1,pcVar1 + psVar5->_M_string_length);
            local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = *(element_type **)local_d8._0_8_;
            local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8._0_8_ + 8))->_M_pi;
            if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            if (local_90 == &local_80) {
              local_c8.Value.first.field_2._8_4_ = local_80._M_use_count;
              local_c8.Value.first.field_2._12_4_ = local_80._M_weak_count;
              local_c8.Value.first._M_dataplus._M_p = (pointer)p_Var2;
            }
            else {
              local_c8.Value.first._M_dataplus._M_p = (pointer)local_90;
            }
            local_c8.Value.first.field_2._M_allocated_capacity._1_7_ =
                 local_80._vptr__Sp_counted_base._1_7_;
            local_c8.Value.first.field_2._M_local_buf[0] = local_80._vptr__Sp_counted_base._0_1_;
            local_c8.Value.first._M_string_length = (size_type)local_88;
            local_88 = (char *)0x0;
            local_80._vptr__Sp_counted_base._0_1_ = 0;
            local_c8.Value.second = bVar12;
            local_90 = &local_80;
            local_70 = bVar12;
            std::
            _Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
            ::_M_emplace_unique<BT<std::pair<std::__cxx11::string,bool>>>
                      ((_Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
                        *)target,
                       (BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                        *)(local_d8 + 0x10));
            if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_c8.Value.first._M_dataplus._M_p != p_Var2) {
              operator_delete(local_c8.Value.first._M_dataplus._M_p,
                              local_c8.Value.first.field_2._M_allocated_capacity + 1);
            }
            if (local_90 != &local_80) {
              operator_delete(local_90,CONCAT71(local_80._vptr__Sp_counted_base._1_7_,
                                                local_80._vptr__Sp_counted_base._0_1_) + 1);
            }
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          } while ((_Rb_tree_header *)p_Var6 != p_Var10);
        }
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_d8);
      paVar4 = local_38;
    }
    if (paVar4 == (anon_unknown_dwarf_1f3d449 *)0xffffffffffffffff) {
      return (string *)(element_type *)local_d8._8_8_;
    }
  } while( true );
}

Assistant:

std::string EvaluateSplitConfigGenex(
  cm::string_view input, cmGeneratorExpression const& ge, cmLocalGenerator* lg,
  bool useOutputConfig, std::string const& outputConfig,
  std::string const& commandConfig, cmGeneratorTarget const* target,
  std::set<BT<std::pair<std::string, bool>>>* utils = nullptr)
{
  std::string result;

  while (!input.empty()) {
    // Copy non-genex content directly to the result.
    std::string::size_type pos = input.find("$<");
    result += input.substr(0, pos);
    if (pos == std::string::npos) {
      break;
    }
    input = input.substr(pos);

    // Find the balanced end of this regex.
    size_t nestingLevel = 1;
    for (pos = 2; pos < input.size(); ++pos) {
      cm::string_view cur = input.substr(pos);
      if (cmHasLiteralPrefix(cur, "$<")) {
        ++nestingLevel;
        ++pos;
        continue;
      }
      if (cmHasLiteralPrefix(cur, ">")) {
        --nestingLevel;
        if (nestingLevel == 0) {
          ++pos;
          break;
        }
      }
    }

    // Split this genex from following input.
    cm::string_view genex = input.substr(0, pos);
    input = input.substr(pos);

    // Convert an outer COMMAND_CONFIG or OUTPUT_CONFIG to the matching config.
    std::string const* config =
      useOutputConfig ? &outputConfig : &commandConfig;
    if (nestingLevel == 0) {
      static cm::string_view const COMMAND_CONFIG = "$<COMMAND_CONFIG:"_s;
      static cm::string_view const OUTPUT_CONFIG = "$<OUTPUT_CONFIG:"_s;
      if (cmHasPrefix(genex, COMMAND_CONFIG)) {
        genex.remove_prefix(COMMAND_CONFIG.size());
        genex.remove_suffix(1);
        useOutputConfig = false;
        config = &commandConfig;
      } else if (cmHasPrefix(genex, OUTPUT_CONFIG)) {
        genex.remove_prefix(OUTPUT_CONFIG.size());
        genex.remove_suffix(1);
        useOutputConfig = true;
        config = &outputConfig;
      }
    }

    // Evaluate this genex in the selected configuration.
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(std::string(genex));
    result += cge->Evaluate(lg, *config, target);

    // Record targets referenced by the genex.
    if (utils) {
      // Use a cross-dependency if we referenced the command config.
      bool const cross = !useOutputConfig;
      for (cmGeneratorTarget* gt : cge->GetTargets()) {
        utils->emplace(BT<std::pair<std::string, bool>>(
          { gt->GetName(), cross }, cge->GetBacktrace()));
      }
    }
  }

  return result;
}